

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockNodePreviewDockSetup
               (ImGuiWindow *host_window,ImGuiDockNode *host_node,ImGuiWindow *root_payload,
               ImGuiDockPreviewData *data,bool is_explicit_target,bool is_outer_docking)

{
  ImVec2 IVar1;
  int iVar2;
  ImGuiDockNode *pIVar3;
  byte bVar4;
  bool bVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImGuiDockNode *pIVar8;
  float *pfVar9;
  ushort uVar10;
  uint uVar11;
  ImVec2 *pIVar12;
  ushort uVar13;
  uint uVar14;
  ImVec2 *pIVar15;
  long lVar16;
  ulong idx;
  ulong idx_00;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  ImRect IVar25;
  ImVec2 *local_88;
  ImVec2 local_80;
  ImRect local_78;
  ImVec2 local_60;
  ImVec2 *local_58;
  ImVec2 pos_old;
  ImVec2 size_old;
  
  pIVar6 = GImGui;
  pIVar3 = root_payload->DockNodeAsHost;
  bVar7 = true;
  if (host_node == (ImGuiDockNode *)0x0) {
LAB_00134296:
    pIVar8 = (ImGuiDockNode *)0x0;
  }
  else {
    uVar11 = *(uint *)&host_node->field_0xb8;
    pIVar8 = host_node;
    if ((uVar11 >> 9 & 1) == 0) {
      pIVar8 = DockNodeGetRootNode(host_node);
      if (pIVar8 == (ImGuiDockNode *)0x0) goto LAB_00134296;
      uVar11 = (uint)*(ushort *)&pIVar8->field_0xb8;
    }
    if ((uVar11 >> 9 & 1) == 0) {
      __assert_fail("ref_node_for_rect->IsVisible",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x3583,
                    "void ImGui::DockNodePreviewDockSetup(ImGuiWindow *, ImGuiDockNode *, ImGuiWindow *, ImGuiDockPreviewData *, bool, bool)"
                   );
    }
    bVar7 = false;
  }
  if (pIVar3 == (ImGuiDockNode *)0x0) {
    uVar11 = (root_payload->WindowClass).DockNodeFlagsOverrideSet;
  }
  else {
    uVar11 = pIVar3->LocalFlags | pIVar3->SharedFlags;
  }
  if (host_node == (ImGuiDockNode *)0x0) {
    uVar14 = (host_window->WindowClass).DockNodeFlagsOverrideSet;
  }
  else {
    uVar14 = host_node->LocalFlags | host_node->SharedFlags;
  }
  data->IsCenterAvailable = true;
  if ((is_outer_docking) || ((uVar14 & 0x10000) != 0)) {
LAB_0013433b:
    data->IsCenterAvailable = false;
  }
  else {
    if ((host_node == (ImGuiDockNode *)0x0) || ((uVar14 & 4) == 0)) {
      if (host_node != (ImGuiDockNode *)0x0) goto LAB_001342f3;
      if (pIVar3 != (ImGuiDockNode *)0x0) goto LAB_00134316;
    }
    else {
      if ((host_node->LocalFlags & 0x800) != 0) goto LAB_0013433b;
LAB_001342f3:
      if ((pIVar3 != (ImGuiDockNode *)0x0) &&
         (host_node->ChildNodes[0] != (ImGuiDockNode *)0x0 || (host_node->Windows).Size != 0)) {
LAB_00134316:
        if ((pIVar3->ChildNodes[0] != (ImGuiDockNode *)0x0) &&
           (pIVar3->OnlyNodeWithWindows == (ImGuiDockNode *)0x0)) goto LAB_0013433b;
      }
    }
    if ((uVar11 & 0x100000) != 0 || (uVar14 & 0x80000) != 0) goto LAB_0013433b;
  }
  data->IsSidesAvailable = true;
  if (((uVar14 & 0x10) == 0) && ((pIVar6->IO).ConfigDockingNoSplit == false)) {
    if ((host_node == (ImGuiDockNode *)0x0 || is_outer_docking) ||
       ((host_node->ParentNode != (ImGuiDockNode *)0x0 || ((host_node->LocalFlags & 0x800) == 0))))
    {
      if ((uVar11 & 0x40000) != 0 || (uVar14 & 0x20000) != 0) goto LAB_00134389;
      goto LAB_00134390;
    }
    data->IsSidesAvailable = false;
LAB_00134399:
    bVar4 = host_node->field_0xb9 & 8;
  }
  else {
LAB_00134389:
    data->IsSidesAvailable = false;
LAB_00134390:
    if (host_node != (ImGuiDockNode *)0x0) goto LAB_00134399;
    bVar4 = host_window->HasCloseButton;
  }
  uVar10 = 0x800;
  if (bVar4 == 0) {
    iVar2._0_1_ = root_payload->HasCloseButton;
    iVar2._1_1_ = root_payload->ResizeBorderHeld;
    iVar2._2_2_ = root_payload->BeginCount;
    uVar10 = (ushort)(iVar2 << 0xb);
  }
  uVar10 = uVar10 | (ushort)*(undefined4 *)&(data->FutureNode).field_0xb8 & 0xf7ff;
  *(ushort *)&(data->FutureNode).field_0xb8 = uVar10;
  uVar13 = 0x1000;
  if (host_node == (ImGuiDockNode *)0x0) {
    uVar13 = (ushort)((~host_window->Flags & 0x20U) << 7);
  }
  *(ushort *)&(data->FutureNode).field_0xb8 = uVar13 | uVar10 & 0xefff;
  pIVar12 = &pIVar8->Pos;
  if (bVar7) {
    pIVar12 = &host_window->Pos;
  }
  (data->FutureNode).Pos = *pIVar12;
  pIVar12 = &host_window->Size;
  if (!bVar7) {
    pIVar12 = &pIVar8->Size;
  }
  (data->FutureNode).Size = *pIVar12;
  data->SplitNode = host_node;
  data->SplitDir = -1;
  data->IsSplitDirExplicit = false;
  if (host_window->Collapsed == false) {
    uVar11 = 0xffffffff;
    pIVar12 = &(pIVar6->IO).MousePos;
    for (lVar16 = 0xd8; lVar16 != 0x128; lVar16 = lVar16 + 0x10) {
      if (lVar16 == 0xd8) {
        if (data->IsCenterAvailable != false) {
LAB_0013448f:
          IVar25 = ImGuiDockNode::Rect(&data->FutureNode);
          fVar22 = IVar25.Max.x - IVar25.Min.x;
          fVar23 = IVar25.Max.y - IVar25.Min.y;
          fVar20 = fVar22;
          if (fVar23 <= fVar22) {
            fVar20 = fVar23;
          }
          fVar18 = GImGui->FontSize * 1.5;
          fVar24 = GImGui->FontSize * 0.5;
          uVar14 = -(uint)(fVar20 * 0.125 <= fVar24);
          fVar20 = (float)(uVar14 & (uint)fVar24 | ~uVar14 & (uint)(fVar20 * 0.125));
          if (fVar20 <= fVar18) {
            fVar18 = fVar20;
          }
          if (is_outer_docking) {
            fVar24 = (float)(int)(fVar18 * 0.8);
            fVar18 = (float)(int)(fVar18 * 1.5);
            fVar22 = (float)(int)(fVar22 * 0.5 - fVar24);
            fVar20 = (float)(int)(fVar23 * 0.5 - fVar24);
          }
          else {
            fVar24 = (float)(int)(fVar18 * 0.9);
            fVar18 = (float)(int)fVar18;
            fVar22 = (float)(int)(fVar18 * 2.4);
            fVar20 = fVar22;
          }
          pIVar15 = (ImVec2 *)((long)(data->FutureNode).ChildNodes + lVar16 + -0x18);
          fVar23 = (float)(int)((IVar25.Min.x + IVar25.Max.x) * 0.5);
          fVar17 = (float)(int)((IVar25.Min.y + IVar25.Max.y) * 0.5);
          if (lVar16 == 0xd8) {
            fVar19 = fVar23 - fVar18;
            fVar21 = fVar17 - fVar18;
            fVar22 = fVar23 + fVar18;
            fVar24 = fVar17 + fVar18;
LAB_00134588:
            pIVar15->x = fVar19;
            pIVar15->y = fVar21;
            pIVar15[1].x = fVar22;
            pIVar15[1].y = fVar24;
          }
          else if (uVar11 < 4) {
            switch(uVar11) {
            case 0:
              fVar19 = (fVar23 - fVar22) - fVar24;
              fVar21 = fVar17 - fVar18;
              fVar22 = (fVar23 - fVar22) + fVar24;
              fVar24 = fVar17 + fVar18;
              break;
            case 1:
              fVar19 = (fVar22 + fVar23) - fVar24;
              fVar21 = fVar17 - fVar18;
              fVar22 = fVar22 + fVar23 + fVar24;
              fVar24 = fVar17 + fVar18;
              break;
            case 2:
              fVar19 = fVar23 - fVar18;
              fVar21 = (fVar17 - fVar20) - fVar24;
              fVar22 = fVar18 + fVar23;
              fVar24 = fVar24 + (fVar17 - fVar20);
              break;
            case 3:
              fVar19 = fVar23 - fVar18;
              fVar21 = (fVar20 + fVar17) - fVar24;
              fVar22 = fVar18 + fVar23;
              fVar24 = fVar24 + fVar20 + fVar17;
            }
            goto LAB_00134588;
          }
          local_78.Min = *pIVar15;
          local_78.Max.x = pIVar15[1].x;
          local_78.Max.y = pIVar15[1].y;
          if (is_outer_docking) {
LAB_00134599:
            bVar7 = ImRect::Contains(&local_78,pIVar12);
            if (bVar7) {
LAB_001345aa:
              data->SplitDir = uVar11;
              data->IsSplitDirExplicit = true;
            }
          }
          else {
            fVar20 = (float)(int)(fVar18 * 0.3);
            local_78.Max.x = fVar20 + local_78.Max.x;
            local_78.Max.y = fVar20 + local_78.Max.y;
            local_78.Min.y = pIVar15->y - fVar20;
            local_78.Min.x = pIVar15->x - fVar20;
            IVar1 = *pIVar12;
            fVar23 = IVar1.x - fVar23;
            fVar17 = IVar1.y - fVar17;
            fVar20 = fVar23 * fVar23 + fVar17 * fVar17;
            if (fVar18 * 1.4 * fVar18 * 1.4 <= fVar20) {
              if (fVar18 * 2.6 * fVar18 * 2.6 <= fVar20) goto LAB_00134599;
              uVar14 = (uint)(0.0 < fVar23);
              if (ABS(fVar23) <= ABS(fVar17)) {
                uVar14 = 0.0 < fVar17 | 2;
              }
              if (uVar11 == uVar14) goto LAB_001345aa;
            }
            else if (lVar16 == 0xd8) goto LAB_001345aa;
          }
        }
      }
      else if (data->IsSidesAvailable == true) goto LAB_0013448f;
      uVar11 = uVar11 + 1;
    }
    uVar11 = data->SplitDir;
    if (uVar11 == 0xffffffff) goto LAB_00134737;
    bVar7 = true;
    bVar5 = false;
  }
  else {
LAB_00134737:
    bVar7 = data->IsCenterAvailable;
    uVar11 = 0xffffffff;
    bVar5 = true;
  }
  data->IsDropAllowed = bVar7;
  if (((!is_explicit_target) && (data->IsSplitDirExplicit == false)) &&
     ((pIVar6->IO).ConfigDockingWithShift == false)) {
    data->IsDropAllowed = false;
  }
  data->SplitRatio = 0.0;
  if (bVar5) {
    return;
  }
  idx_00 = (ulong)(uVar11 >= 2);
  idx = (ulong)(uVar11 < 2);
  local_80.x = 0.0;
  local_80.y = 0.0;
  pos_old = (data->FutureNode).Pos;
  local_88 = &pos_old;
  local_60.x = 0.0;
  local_60.y = 0.0;
  size_old = (data->FutureNode).Size;
  local_78.Min = root_payload->Size;
  fVar20 = (GImGui->Style).ItemInnerSpacing.x;
  pfVar9 = ImVec2::operator[](local_88,idx);
  fVar22 = *pfVar9;
  pfVar9 = ImVec2::operator[](&local_80,idx);
  *pfVar9 = fVar22;
  pfVar9 = ImVec2::operator[](&size_old,idx);
  fVar22 = *pfVar9;
  pfVar9 = ImVec2::operator[](&local_60,idx);
  *pfVar9 = fVar22;
  pfVar9 = ImVec2::operator[](&size_old,idx_00);
  fVar22 = *pfVar9 - fVar20;
  pfVar9 = ImVec2::operator[](&local_78.Min,idx_00);
  if ((*pfVar9 <= 0.0) ||
     (pfVar9 = ImVec2::operator[](&local_78.Min,idx_00), fVar22 * 0.5 < *pfVar9)) {
    fVar23 = (float)(int)(fVar22 * 0.5);
  }
  else {
    pfVar9 = ImVec2::operator[](&local_78.Min,idx_00);
    fVar23 = *pfVar9;
  }
  pIVar12 = &local_80;
  local_58 = &(data->FutureNode).Size;
  pfVar9 = ImVec2::operator[](&local_60,idx_00);
  *pfVar9 = fVar23;
  pfVar9 = ImVec2::operator[](&local_60,idx_00);
  fVar23 = *pfVar9;
  pfVar9 = ImVec2::operator[](&size_old,idx_00);
  *pfVar9 = (float)(int)(fVar22 - fVar23);
  uVar11 = uVar11 & 0xfffffffd;
  pIVar15 = &size_old;
  if (uVar11 != 1) {
    if (uVar11 != 0) goto LAB_001349bc;
    pIVar12 = &pos_old;
    pfVar9 = ImVec2::operator[](pIVar12,idx_00);
    fVar22 = *pfVar9;
    local_88 = &local_80;
    pfVar9 = ImVec2::operator[](local_88,idx_00);
    *pfVar9 = fVar22;
    pIVar15 = &local_60;
  }
  pfVar9 = ImVec2::operator[](local_88,idx_00);
  fVar22 = *pfVar9;
  pfVar9 = ImVec2::operator[](pIVar15,idx_00);
  fVar23 = *pfVar9;
  pfVar9 = ImVec2::operator[](pIVar12,idx_00);
  *pfVar9 = fVar20 + fVar22 + fVar23;
LAB_001349bc:
  pfVar9 = ImVec2::operator[](&local_60,idx_00);
  fVar20 = *pfVar9;
  pfVar9 = ImVec2::operator[](local_58,idx_00);
  fVar20 = fVar20 / *pfVar9;
  fVar22 = 1.0;
  if (fVar20 <= 1.0) {
    fVar22 = fVar20;
  }
  fVar22 = (float)(~-(uint)(fVar20 < 0.0) & (uint)fVar22);
  (data->FutureNode).Pos = local_80;
  (data->FutureNode).Size = local_60;
  if (uVar11 == 1) {
    fVar22 = 1.0 - fVar22;
  }
  data->SplitRatio = fVar22;
  return;
}

Assistant:

static void ImGui::DockNodePreviewDockSetup(ImGuiWindow* host_window, ImGuiDockNode* host_node, ImGuiWindow* root_payload, ImGuiDockPreviewData* data, bool is_explicit_target, bool is_outer_docking)
{
    ImGuiContext& g = *GImGui;

    // There is an edge case when docking into a dockspace which only has inactive nodes.
    // In this case DockNodeTreeFindNodeByPos() will have selected a leaf node which is inactive.
    // Because the inactive leaf node doesn't have proper pos/size yet, we'll use the root node as reference.
    ImGuiDockNode* root_payload_as_host = root_payload->DockNodeAsHost;
    ImGuiDockNode* ref_node_for_rect = (host_node && !host_node->IsVisible) ? DockNodeGetRootNode(host_node) : host_node;
    if (ref_node_for_rect)
        IM_ASSERT(ref_node_for_rect->IsVisible);

    // Filter, figure out where we are allowed to dock
    ImGuiDockNodeFlags src_node_flags = root_payload_as_host ? root_payload_as_host->GetMergedFlags() : root_payload->WindowClass.DockNodeFlagsOverrideSet;
    ImGuiDockNodeFlags dst_node_flags = host_node ? host_node->GetMergedFlags() : host_window->WindowClass.DockNodeFlagsOverrideSet;
    data->IsCenterAvailable = true;
    if (is_outer_docking)
        data->IsCenterAvailable = false;
    else if (dst_node_flags & ImGuiDockNodeFlags_NoDocking)
        data->IsCenterAvailable = false;
    else if (host_node && (dst_node_flags & ImGuiDockNodeFlags_NoDockingInCentralNode) && host_node->IsCentralNode())
        data->IsCenterAvailable = false;
    else if ((!host_node || !host_node->IsEmpty()) && root_payload_as_host && root_payload_as_host->IsSplitNode() && (root_payload_as_host->OnlyNodeWithWindows == NULL)) // Is _visibly_ split?
        data->IsCenterAvailable = false;
    else if ((dst_node_flags & ImGuiDockNodeFlags_NoDockingOverMe) || (src_node_flags & ImGuiDockNodeFlags_NoDockingOverOther))
        data->IsCenterAvailable = false;

    data->IsSidesAvailable = true;
    if ((dst_node_flags & ImGuiDockNodeFlags_NoSplit) || g.IO.ConfigDockingNoSplit)
        data->IsSidesAvailable = false;
    else if (!is_outer_docking && host_node && host_node->ParentNode == NULL && host_node->IsCentralNode())
        data->IsSidesAvailable = false;
    else if ((dst_node_flags & ImGuiDockNodeFlags_NoDockingSplitMe) || (src_node_flags & ImGuiDockNodeFlags_NoDockingSplitOther))
        data->IsSidesAvailable = false;

    // Build a tentative future node (reuse same structure because it is practical. Shape will be readjusted when previewing a split)
    data->FutureNode.HasCloseButton = (host_node ? host_node->HasCloseButton : host_window->HasCloseButton) || (root_payload->HasCloseButton);
    data->FutureNode.HasWindowMenuButton = host_node ? true : ((host_window->Flags & ImGuiWindowFlags_NoCollapse) == 0);
    data->FutureNode.Pos = ref_node_for_rect ? ref_node_for_rect->Pos : host_window->Pos;
    data->FutureNode.Size = ref_node_for_rect ? ref_node_for_rect->Size : host_window->Size;

    // Calculate drop shapes geometry for allowed splitting directions
    IM_ASSERT(ImGuiDir_None == -1);
    data->SplitNode = host_node;
    data->SplitDir = ImGuiDir_None;
    data->IsSplitDirExplicit = false;
    if (!host_window->Collapsed)
        for (int dir = ImGuiDir_None; dir < ImGuiDir_COUNT; dir++)
        {
            if (dir == ImGuiDir_None && !data->IsCenterAvailable)
                continue;
            if (dir != ImGuiDir_None && !data->IsSidesAvailable)
                continue;
            if (DockNodeCalcDropRectsAndTestMousePos(data->FutureNode.Rect(), (ImGuiDir)dir, data->DropRectsDraw[dir+1], is_outer_docking, &g.IO.MousePos))
            {
                data->SplitDir = (ImGuiDir)dir;
                data->IsSplitDirExplicit = true;
            }
        }

    // When docking without holding Shift, we only allow and preview docking when hovering over a drop rect or over the title bar
    data->IsDropAllowed = (data->SplitDir != ImGuiDir_None) || (data->IsCenterAvailable);
    if (!is_explicit_target && !data->IsSplitDirExplicit && !g.IO.ConfigDockingWithShift)
        data->IsDropAllowed = false;

    // Calculate split area
    data->SplitRatio = 0.0f;
    if (data->SplitDir != ImGuiDir_None)
    {
        ImGuiDir split_dir = data->SplitDir;
        ImGuiAxis split_axis = (split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Right) ? ImGuiAxis_X : ImGuiAxis_Y;
        ImVec2 pos_new, pos_old = data->FutureNode.Pos;
        ImVec2 size_new, size_old = data->FutureNode.Size;
        DockNodeCalcSplitRects(pos_old, size_old, pos_new, size_new, split_dir, root_payload->Size);

        // Calculate split ratio so we can pass it down the docking request
        float split_ratio = ImSaturate(size_new[split_axis] / data->FutureNode.Size[split_axis]);
        data->FutureNode.Pos = pos_new;
        data->FutureNode.Size = size_new;
        data->SplitRatio = (split_dir == ImGuiDir_Right || split_dir == ImGuiDir_Down) ? (1.0f - split_ratio) : (split_ratio);
    }
}